

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::compareGenMipmapVeryLenient
              (ConstPixelBufferAccess *dst,ConstPixelBufferAccess *src,PixelBufferAccess *errorMask,
              GenMipmapPrecision *precision)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int z;
  int y;
  int ky;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vec4 maxVal;
  Vec4 minVal;
  Vec4 sample;
  Vec4 result;
  int local_c8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  float local_70;
  float fStack_6c;
  PixelBufferAccess *local_60;
  tcu local_54 [4];
  float local_50;
  float fStack_4c;
  Vector<float,_4> local_40;
  
  iVar4 = (dst->m_size).m_data[0];
  fVar6 = (float)iVar4;
  iVar3 = (dst->m_size).m_data[1];
  fVar7 = (float)iVar3;
  fVar8 = (float)(src->m_size).m_data[0];
  fVar9 = (float)(src->m_size).m_data[1];
  local_c8 = 0;
  local_60 = errorMask;
  for (z = 0; z < iVar3; z = z + 1) {
    fVar10 = floorf((((float)z + -0.5) / fVar7) * fVar9);
    fVar11 = ceilf((((float)z + 1.5) / fVar7) * fVar9);
    for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_40,(int)dst,iVar3,z);
      fVar12 = floorf((((float)iVar3 + -0.5) / fVar6) * fVar8);
      fVar13 = ceilf((((float)iVar3 + 1.5) / fVar6) * fVar8);
      tcu::Vector<float,_4>::Vector(&local_88);
      tcu::Vector<float,_4>::Vector(&local_98);
      for (iVar4 = (int)fVar10; iVar4 <= (int)fVar11; iVar4 = iVar4 + 1) {
        for (iVar5 = 0; iVar2 = iVar5 + (int)fVar12, iVar2 <= (int)fVar13; iVar5 = iVar5 + 1) {
          y = (src->m_size).m_data[0] + -1;
          if (iVar2 < y) {
            y = iVar2;
          }
          if (iVar2 < 0) {
            y = 0;
          }
          iVar2 = (src->m_size).m_data[1] + -1;
          if (iVar4 < iVar2) {
            iVar2 = iVar4;
          }
          if (iVar4 < 0) {
            iVar2 = 0;
          }
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&local_50,(int)src,y,iVar2);
          if (iVar4 == (int)fVar10 && iVar5 == 0) {
            local_88.m_data[1] = fStack_4c;
            local_88.m_data[0] = local_50;
            local_98.m_data[0] = local_50;
          }
          else {
            tcu::min<float,4>((tcu *)&local_70,(Vector<float,_4> *)&local_50,&local_88);
            local_88.m_data[1] = fStack_6c;
            local_88.m_data[0] = local_70;
            tcu::max<float,4>((tcu *)&local_70,(Vector<float,_4> *)&local_50,&local_98);
            local_98.m_data[0] = local_70;
          }
        }
      }
      tcu::lessThanEqual<float,4>((tcu *)&local_70,&local_88,&local_40);
      tcu::lessThanEqual<float,4>(local_54,&local_40,&local_98);
      tcu::logicalAnd<bool,4>
                ((tcu *)&local_50,(Vector<bool,_4> *)&local_70,(Vector<bool,_4> *)local_54);
      bVar1 = tcu::boolAll<4>((Vector<bool,_4> *)&local_50);
      if (bVar1) {
        local_70 = -1.7146522e+38;
      }
      else {
        local_70 = -1.7014636e+38;
      }
      tcu::RGBA::toVec((RGBA *)&local_70);
      tcu::PixelBufferAccess::setPixel(local_60,(Vec4 *)&local_50,iVar3,z,0);
      local_c8 = local_c8 + (uint)!bVar1;
      iVar4 = (dst->m_size).m_data[0];
    }
    iVar3 = (dst->m_size).m_data[1];
  }
  return local_c8;
}

Assistant:

static int compareGenMipmapVeryLenient (const tcu::ConstPixelBufferAccess& dst, const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& errorMask, const GenMipmapPrecision& precision)
{
	DE_ASSERT(dst.getDepth() == 1 && src.getDepth() == 1); // \todo [2013-10-29 pyry] 3D textures.
	DE_UNREF(precision);

	const float		dstW		= float(dst.getWidth());
	const float		dstH		= float(dst.getHeight());
	const float		srcW		= float(src.getWidth());
	const float		srcH		= float(src.getHeight());
	int				numFailed	= 0;

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		const tcu::Vec4	result	= dst.getPixel(x, y);
		const int		minX		= deFloorFloatToInt32(((float)x-0.5f) / dstW * srcW);
		const int		minY		= deFloorFloatToInt32(((float)y-0.5f) / dstH * srcH);
		const int		maxX		= deCeilFloatToInt32(((float)x+1.5f) / dstW * srcW);
		const int		maxY		= deCeilFloatToInt32(((float)y+1.5f) / dstH * srcH);
		tcu::Vec4		minVal, maxVal;
		bool			isOk;

		DE_ASSERT(minX < maxX && minY < maxY);

		for (int ky = minY; ky <= maxY; ky++)
		{
			for (int kx = minX; kx <= maxX; kx++)
			{
				const int		sx		= de::clamp(kx, 0, src.getWidth()-1);
				const int		sy		= de::clamp(ky, 0, src.getHeight()-1);
				const tcu::Vec4	sample	= src.getPixel(sx, sy);

				if (ky == minY && kx == minX)
				{
					minVal = sample;
					maxVal = sample;
				}
				else
				{
					minVal = min(sample, minVal);
					maxVal = max(sample, maxVal);
				}
			}
		}

		isOk = boolAll(logicalAnd(lessThanEqual(minVal, result), lessThanEqual(result, maxVal)));

		errorMask.setPixel(isOk ? tcu::RGBA::green().toVec() : tcu::RGBA::red().toVec(), x, y);
		if (!isOk)
			numFailed += 1;
	}

	return numFailed;
}